

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  ulong uVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  mbedtls_md_info_t *pmVar5;
  size_t sVar6;
  ulong slen;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  char *ilen;
  uchar *puVar10;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  mbedtls_md_context_t local_498;
  uchar local_480 [71];
  char acStack_439 [1033];
  
  if ((mode == 1) && (ctx->padding != 1)) {
    return -0x4080;
  }
  sVar2 = ctx->len;
  if (0xfffffffffffffc0e < sVar2 - 0x401) {
    if (mode == 0) {
      iVar4 = mbedtls_rsa_public(ctx,sig,(uchar *)(acStack_439 + 1));
    }
    else {
      iVar4 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,(uchar *)(acStack_439 + 1));
    }
    if (iVar4 != 0) {
      return iVar4;
    }
    if (acStack_439[sVar2] != -0x44) {
      return -0x4100;
    }
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar5 = mbedtls_md_info_from_type(md_alg);
      if (pmVar5 == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar3 = mbedtls_md_get_size(pmVar5);
      hashlen = (uint)bVar3;
    }
    pmVar5 = mbedtls_md_info_from_type(mgf1_hash_id);
    if (pmVar5 != (mbedtls_md_info_t *)0x0) {
      bVar3 = mbedtls_md_get_size(pmVar5);
      local_480[0] = '\0';
      local_480[1] = '\0';
      local_480[2] = '\0';
      local_480[3] = '\0';
      local_480[4] = '\0';
      local_480[5] = '\0';
      local_480[6] = '\0';
      local_480[7] = '\0';
      sVar6 = mbedtls_mpi_bitlen(&ctx->N);
      uVar1 = sVar6 - 1;
      sVar9 = sVar2 - 1;
      if ((uVar1 & 7) != 0) {
        sVar9 = sVar2;
      }
      if ((byte)acStack_439[1] >> ((char)sVar6 + (char)sVar9 * -8 + 7U & 0x1f) != 0) {
        return -0x4080;
      }
      slen = (ulong)bVar3;
      uVar7 = ~slen;
      uVar8 = (ulong)((uVar1 & 7) == 0);
      puVar10 = (uchar *)(acStack_439 + uVar8 + 1);
      mbedtls_md_init(&local_498);
      mbedtls_md_setup(&local_498,pmVar5,0);
      mgf_mask(puVar10,uVar7 + sVar9,puVar10 + uVar7 + sVar9,slen,&local_498);
      acStack_439[1] = acStack_439[1] & (byte)(0xff >> ((char)sVar9 * '\b' - (char)uVar1 & 0x1fU));
      if ((long)uVar8 < (long)sVar9) {
        do {
          if (*puVar10 != '\0') break;
          puVar10 = puVar10 + 1;
        } while (puVar10 < acStack_439 + sVar9 + 1);
      }
      if ((puVar10 != (uchar *)(acStack_439 + sVar9 + 1)) && (*puVar10 == '\x01')) {
        puVar10 = puVar10 + 1;
        ilen = acStack_439 + ((sVar2 + uVar7) - (long)puVar10) + 1;
        if ((expected_salt_len == -1) || (ilen == (char *)(long)expected_salt_len)) {
          mbedtls_md_starts(&local_498);
          mbedtls_md_update(&local_498,local_480,8);
          mbedtls_md_update(&local_498,hash,(ulong)hashlen);
          mbedtls_md_update(&local_498,puVar10,(size_t)ilen);
          mbedtls_md_finish(&local_498,local_480 + 8);
          mbedtls_md_free(&local_498);
          iVar4 = bcmp(puVar10 + (long)ilen,local_480 + 8,slen);
          if (iVar4 == 0) {
            return 0;
          }
          return -0x4380;
        }
      }
      mbedtls_md_free(&local_498);
      return -0x4100;
    }
  }
  return -0x4080;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret;
    size_t siglen;
    unsigned char *p;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t slen, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        // Gather length of hash to sign
        //
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = siglen - hlen - 1; /* Currently length of salt + padding */

    memset( zeros, 0, 8 );

    // Note: EMSA-PSS verification is over the length of N - 1 bits
    //
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    // Compensate for boundary condition when applying mask
    //
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }
    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_md_init( &md_ctx );
    mbedtls_md_setup( &md_ctx, md_info, 0 );

    mgf_mask( p, siglen - hlen - 1, p + siglen - hlen - 1, hlen, &md_ctx );

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < buf + siglen && *p == 0 )
        p++;

    if( p == buf + siglen ||
        *p++ != 0x01 )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /* Actual salt len */
    slen -= p - buf;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        slen != (size_t) expected_salt_len )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    // Generate H = Hash( M' )
    //
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, zeros, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, p, slen );
    mbedtls_md_finish( &md_ctx, result );

    mbedtls_md_free( &md_ctx );

    if( memcmp( p + slen, result, hlen ) == 0 )
        return( 0 );
    else
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
}